

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.cc
# Opt level: O2

Euclidean_distance_matrix *
read_point_cloud(Euclidean_distance_matrix *__return_storage_ptr__,istream *input_stream)

{
  pointer pvVar1;
  pointer pvVar2;
  istream *piVar3;
  pointer pfVar4;
  ostream *poVar5;
  vector<float,_std::allocator<float>_> point;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  points;
  value_t value;
  string line;
  istringstream s;
  
  points.
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  points.
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  points.
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  line.field_2._M_local_buf[0] = '\0';
  while( true ) {
    piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       (input_stream,(string *)&line);
    if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) {
      Gudhi::ripser::Euclidean_distance_matrix<Params>::Euclidean_distance_matrix
                (__return_storage_ptr__,&points);
      pvVar1 = (__return_storage_ptr__->points).
               super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pvVar2 = (__return_storage_ptr__->points).
               super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      poVar5 = std::operator<<((ostream *)&std::cout,"point cloud with ");
      poVar5 = (ostream *)
               std::ostream::operator<<(poVar5,(int)(((long)pvVar2 - (long)pvVar1) / 0x18));
      poVar5 = std::operator<<(poVar5," points in dimension ");
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      std::endl<char,std::char_traits<char>>(poVar5);
      std::__cxx11::string::~string((string *)&line);
      std::
      vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ::~vector(&points);
      return __return_storage_ptr__;
    }
    point.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    point.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    point.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::__cxx11::istringstream::istringstream((istringstream *)&s,(string *)&line,_S_in);
    while( true ) {
      piVar3 = std::istream::_M_extract<float>((float *)&s);
      if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) break;
      std::vector<float,_std::allocator<float>_>::push_back(&point,&value);
      std::istream::ignore();
    }
    pfVar4 = point.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
             ._M_start;
    if (point.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        point.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      std::
      vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ::push_back(&points,&point);
      pfVar4 = point.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish;
    }
    if ((long)pfVar4 -
        (long)point.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start !=
        (long)((points.
                super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
              _M_finish -
        (long)((points.
                super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
              _M_start) break;
    std::__cxx11::istringstream::~istringstream((istringstream *)&s);
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              (&point.super__Vector_base<float,_std::allocator<float>_>);
  }
  __assert_fail("point.size() == points.front().size()",
                "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Ripser/utilities/ripser.cc"
                ,0x6a,"Euclidean_distance_matrix read_point_cloud(std::istream &)");
}

Assistant:

Euclidean_distance_matrix read_point_cloud(std::istream& input_stream) {
  std::vector<std::vector<value_t>> points;

  std::string line;
  value_t value;
  while (std::getline(input_stream, line)) {
    std::vector<value_t> point;
    std::istringstream s(line);
    while (s >> value) {
      point.push_back(value);
      s.ignore();
    }
    if (!point.empty()) points.push_back(point);
    assert(point.size() == points.front().size());
  }

  std::size_t d = points.front().size();
  Euclidean_distance_matrix eucl_dist(std::move(points));
  vertex_t n = eucl_dist.size();
  std::cout << "point cloud with " << n << " points in dimension "
    << d << std::endl;

  return eucl_dist;
}